

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReaderIncrInit(PmaReader *pReadr,int eMode)

{
  IncrMerger *pIVar1;
  int iVar2;
  void *pCtx;
  
  pIVar1 = pReadr->pIncr;
  if (pIVar1 == (IncrMerger *)0x0) {
    return 0;
  }
  if (pIVar1->bUseThread != 0) {
    iVar2 = vdbeSorterCreateThread(pIVar1->pTask,vdbePmaReaderBgIncrInit,pReadr);
    return iVar2;
  }
  iVar2 = vdbePmaReaderIncrMergeInit(pReadr,eMode);
  return iVar2;
}

Assistant:

static int vdbePmaReaderIncrInit(PmaReader *pReadr, int eMode){
  IncrMerger *pIncr = pReadr->pIncr;   /* Incremental merger */
  int rc = SQLITE_OK;                  /* Return code */
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    assert( pIncr->bUseThread==0 || eMode==INCRINIT_TASK );
    if( pIncr->bUseThread ){
      void *pCtx = (void*)pReadr;
      rc = vdbeSorterCreateThread(pIncr->pTask, vdbePmaReaderBgIncrInit, pCtx);
    }else
#endif
    {
      rc = vdbePmaReaderIncrMergeInit(pReadr, eMode);
    }
  }
  return rc;
}